

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# artifact.c
# Opt level: O2

boolean arti_reflects(obj *obj)

{
  long lVar1;
  
  if ((obj != (obj *)0x0) && (lVar1 = (long)obj->oartifact, lVar1 != 0)) {
    if (((obj->owornmask & 0xffffefffU) != 0) && ((artilist[lVar1].spfx & 0x4000000) != 0)) {
      return '\x01';
    }
    if ((artilist[lVar1].cspfx & 0x4000000) != 0) {
      return '\x01';
    }
  }
  return '\0';
}

Assistant:

boolean arti_reflects(struct obj *obj)
{
    const struct artifact *arti = get_artifact(obj);

    if (arti) {      
	/* while being worn */
	if ((obj->owornmask & ~W_ART) && (arti->spfx & SPFX_REFLECT))
	    return TRUE;
	/* just being carried */
	if (arti->cspfx & SPFX_REFLECT) return TRUE;
    }
    return FALSE;
}